

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

int uv_tcp_keepalive(uv_tcp_t *handle,int on,uint delay)

{
  int err;
  uint delay_local;
  int on_local;
  uv_tcp_t *handle_local;
  
  if (((handle->io_watcher).fd == -1) ||
     (handle_local._4_4_ = uv__tcp_keepalive((handle->io_watcher).fd,on,delay),
     handle_local._4_4_ == 0)) {
    if (on == 0) {
      handle->flags = handle->flags & 0xfdffffff;
    }
    else {
      handle->flags = handle->flags | 0x2000000;
    }
    handle_local._4_4_ = 0;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_tcp_keepalive(uv_tcp_t* handle, int on, unsigned int delay) {
  int err;

  if (uv__stream_fd(handle) != -1) {
    err =uv__tcp_keepalive(uv__stream_fd(handle), on, delay);
    if (err)
      return err;
  }

  if (on)
    handle->flags |= UV_HANDLE_TCP_KEEPALIVE;
  else
    handle->flags &= ~UV_HANDLE_TCP_KEEPALIVE;

  /* TODO Store delay if uv__stream_fd(handle) == -1 but don't want to enlarge
   *      uv_tcp_t with an int that's almost never used...
   */

  return 0;
}